

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O2

string * get_diget<cppcms::crypto::message_digest>
                   (string *__return_storage_ptr__,message_digest *d,string *source)

{
  uint uVar1;
  uchar buf [256];
  uchar auStack_128 [264];
  
  (**(code **)(*(long *)d + 0x20))(d,(source->_M_dataplus)._M_p,source->_M_string_length);
  uVar1 = (**(code **)(*(long *)d + 0x10))(d);
  (**(code **)(*(long *)d + 0x28))(d,auStack_128);
  to_string_abi_cxx11_(__return_storage_ptr__,auStack_128,(ulong)uVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string get_diget(MD &d,std::string const &source)
{
	unsigned char buf[256];
	d.append(source.c_str(),source.size());
	unsigned n=d.digest_size();
	d.readout(buf);
	return to_string(buf,n);
}